

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

uint __thiscall jpgd::jpeg_decoder::get_bits_no_markers(jpeg_decoder *this,int num_bits)

{
  byte bVar1;
  uint8 uVar2;
  uint8 uVar3;
  int iVar4;
  uint c2;
  uint c1;
  uint i;
  int num_bits_local;
  jpeg_decoder *this_local;
  
  if (num_bits == 0) {
    this_local._4_4_ = 0;
  }
  else {
    if (0x10 < num_bits) {
      __assert_fail("num_bits <= 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x1ea,"uint jpgd::jpeg_decoder::get_bits_no_markers(int)");
    }
    bVar1 = (byte)num_bits;
    this_local._4_4_ = this->m_bit_buf >> (0x20 - bVar1 & 0x1f);
    iVar4 = this->m_bits_left - num_bits;
    this->m_bits_left = iVar4;
    if (iVar4 < 1) {
      this->m_bit_buf = this->m_bit_buf << ((char)this->m_bits_left + bVar1 & 0x1f);
      if (((this->m_in_buf_left < 2) || (*this->m_pIn_buf_ofs == 0xff)) ||
         (this->m_pIn_buf_ofs[1] == 0xff)) {
        uVar2 = get_octet(this);
        uVar3 = get_octet(this);
        this->m_bit_buf = (uint)CONCAT11(uVar2,uVar3) | this->m_bit_buf;
      }
      else {
        this->m_bit_buf =
             (uint)CONCAT11(*this->m_pIn_buf_ofs,this->m_pIn_buf_ofs[1]) | this->m_bit_buf;
        this->m_in_buf_left = this->m_in_buf_left + -2;
        this->m_pIn_buf_ofs = this->m_pIn_buf_ofs + 2;
      }
      this->m_bit_buf = this->m_bit_buf << (-(char)this->m_bits_left & 0x1fU);
      this->m_bits_left = this->m_bits_left + 0x10;
      if (this->m_bits_left < 0) {
        __assert_fail("m_bits_left >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                      ,0x203,"uint jpgd::jpeg_decoder::get_bits_no_markers(int)");
      }
    }
    else {
      this->m_bit_buf = this->m_bit_buf << (bVar1 & 0x1f);
    }
  }
  return this_local._4_4_;
}

Assistant:

inline uint jpeg_decoder::get_bits_no_markers(int num_bits)
	{
		if (!num_bits)
			return 0;

		assert(num_bits <= 16);

		uint i = m_bit_buf >> (32 - num_bits);

		if ((m_bits_left -= num_bits) <= 0)
		{
			m_bit_buf <<= (num_bits += m_bits_left);

			if ((m_in_buf_left < 2) || (m_pIn_buf_ofs[0] == 0xFF) || (m_pIn_buf_ofs[1] == 0xFF))
			{
				uint c1 = get_octet();
				uint c2 = get_octet();
				m_bit_buf |= (c1 << 8) | c2;
			}
			else
			{
				m_bit_buf |= ((uint)m_pIn_buf_ofs[0] << 8) | m_pIn_buf_ofs[1];
				m_in_buf_left -= 2;
				m_pIn_buf_ofs += 2;
			}

			m_bit_buf <<= -m_bits_left;

			m_bits_left += 16;

			assert(m_bits_left >= 0);
		}
		else
			m_bit_buf <<= num_bits;

		return i;
	}